

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergefiles.c
# Opt level: O2

econf_err merge_econf_files(econf_file **key_files,econf_file **merged_files)

{
  econf_file **ppeVar1;
  econf_file *peVar2;
  econf_file **ppeVar3;
  int iVar4;
  econf_err eVar5;
  char *__s1;
  char *__s2;
  econf_err eVar6;
  econf_file **ppeVar7;
  econf_file **ppeVar8;
  
  if (merged_files == (econf_file **)0x0 || *key_files == (econf_file *)0x0) {
    eVar6 = ECONF_ERROR;
  }
  else {
    *merged_files = *key_files;
    eVar6 = ECONF_SUCCESS;
    ppeVar8 = key_files + 1;
    while (*ppeVar8 != (econf_file *)0x0) {
      peVar2 = *merged_files;
      ppeVar1 = ppeVar8 + 1;
      __s1 = __xpg_basename((*ppeVar8)->path);
      ppeVar3 = ppeVar1;
      do {
        ppeVar7 = ppeVar3;
        if (*ppeVar7 == (econf_file *)0x0) goto LAB_00105a14;
        __s2 = __xpg_basename((*ppeVar7)->path);
        iVar4 = strcmp(__s1,__s2);
        ppeVar3 = ppeVar7 + 1;
      } while (iVar4 != 0);
      if (*ppeVar7 == (econf_file *)0x0) {
LAB_00105a14:
        eVar5 = econf_mergeFiles(merged_files,*merged_files,*ppeVar8);
        if (eVar5 != ECONF_SUCCESS) {
          return eVar5;
        }
        if (*merged_files == (econf_file *)0x0) {
          return ECONF_SUCCESS;
        }
        (*merged_files)->on_merge_delete = true;
        if (peVar2->on_merge_delete == true) {
          econf_freeFile(peVar2);
        }
      }
      peVar2 = *ppeVar8;
      ppeVar8 = ppeVar1;
      if (peVar2->on_merge_delete == true) {
        econf_freeFile(peVar2);
      }
    }
  }
  return eVar6;
}

Assistant:

econf_err merge_econf_files(econf_file **key_files, econf_file **merged_files) {
  if (*key_files == NULL || merged_files == NULL)
    return ECONF_ERROR;

  *merged_files = *key_files++;
  if(*merged_files == NULL)
    return ECONF_ERROR;

  while(*key_files) {
    econf_err error;
    econf_file *tmp = *merged_files;
    econf_file **double_key_files = key_files+1;
    char * current_file = basename((*key_files)->path);

    /* key_files are already sorted. If there is a file with the same name with
       a higher priority, the current file will be ignored.
       e.g. /usr/etc/shells.d/tcsh will not be merged if /etc/shells.d/tcsh exists.
    */
    while (*double_key_files) {
      char * compare_file = basename((*double_key_files)->path);
      if (strcmp(current_file, compare_file) == 0) {
	break;
      }
      double_key_files++;
    }

    if (*double_key_files == NULL) {
      error = econf_mergeFiles(merged_files, *merged_files, *key_files);
      if (error || *merged_files == NULL)
        return error;
      (*merged_files)->on_merge_delete = 1;
      if(tmp->on_merge_delete) { econf_free(tmp); }
    }

    if((*key_files)->on_merge_delete) { econf_free(*key_files); }

    key_files++;
  }

  return ECONF_SUCCESS;
}